

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleColsUp2_SSE2(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  bool bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  int iVar18;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_ptr_local;
  uint8_t *dst_ptr_local;
  
  do {
    uVar2 = *src_ptr;
    uVar3 = src_ptr[1];
    uVar4 = src_ptr[2];
    uVar5 = src_ptr[3];
    uVar6 = src_ptr[4];
    uVar7 = src_ptr[5];
    uVar8 = src_ptr[6];
    uVar9 = src_ptr[7];
    uVar10 = src_ptr[8];
    uVar11 = src_ptr[9];
    uVar12 = src_ptr[10];
    uVar13 = src_ptr[0xb];
    uVar14 = src_ptr[0xc];
    uVar15 = src_ptr[0xd];
    uVar16 = src_ptr[0xe];
    uVar17 = src_ptr[0xf];
    src_ptr = src_ptr + 0x10;
    *dst_ptr = uVar2;
    dst_ptr[1] = uVar2;
    dst_ptr[2] = uVar3;
    dst_ptr[3] = uVar3;
    dst_ptr[4] = uVar4;
    dst_ptr[5] = uVar4;
    dst_ptr[6] = uVar5;
    dst_ptr[7] = uVar5;
    dst_ptr[8] = uVar6;
    dst_ptr[9] = uVar6;
    dst_ptr[10] = uVar7;
    dst_ptr[0xb] = uVar7;
    dst_ptr[0xc] = uVar8;
    dst_ptr[0xd] = uVar8;
    dst_ptr[0xe] = uVar9;
    dst_ptr[0xf] = uVar9;
    dst_ptr[0x10] = uVar10;
    dst_ptr[0x11] = uVar10;
    dst_ptr[0x12] = uVar11;
    dst_ptr[0x13] = uVar11;
    dst_ptr[0x14] = uVar12;
    dst_ptr[0x15] = uVar12;
    dst_ptr[0x16] = uVar13;
    dst_ptr[0x17] = uVar13;
    dst_ptr[0x18] = uVar14;
    dst_ptr[0x19] = uVar14;
    dst_ptr[0x1a] = uVar15;
    dst_ptr[0x1b] = uVar15;
    dst_ptr[0x1c] = uVar16;
    dst_ptr[0x1d] = uVar16;
    dst_ptr[0x1e] = uVar17;
    dst_ptr[0x1f] = uVar17;
    dst_ptr = dst_ptr + 0x20;
    iVar18 = dst_width + -0x20;
    bVar1 = 0x1f < dst_width;
    dst_width = iVar18;
  } while (iVar18 != 0 && bVar1);
  return;
}

Assistant:

void ScaleColsUp2_SSE2(uint8_t* dst_ptr,
                       const uint8_t* src_ptr,
                       int dst_width,
                       int x,
                       int dx) {
  (void)x;
  (void)dx;
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%1),%%xmm0                   \n"
      "lea         0x10(%1),%1                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklbw   %%xmm0,%%xmm0                 \n"
      "punpckhbw   %%xmm1,%%xmm1                 \n"
      "movdqu      %%xmm0,(%0)                   \n"
      "movdqu      %%xmm1,0x10(%0)               \n"
      "lea         0x20(%0),%0                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"

      : "+r"(dst_ptr),   // %0
        "+r"(src_ptr),   // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1");
}